

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

void __thiscall
mp::NameProvider::NameProvider
          (NameProvider *this,CStringRef filename,CStringRef gen_name,size_t num_items)

{
  allocator<char> local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  NameReader *local_38;
  
  (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->gen_name_,gen_name.data_,&local_41);
  local_40 = &(this->gen_name_2_).field_2;
  (this->gen_name_2_)._M_dataplus._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->gen_name_2_,"_extra_","");
  local_38 = &this->reader_;
  (this->reader_).mapped_file_.super_MemoryMappedFileBase.start_ = (char *)0x0;
  (this->reader_).mapped_file_.super_MemoryMappedFileBase.size_ = 0;
  (this->writer_).super_BasicWriter<char>.buffer_ = &(this->writer_).buffer_.super_Buffer<char>;
  (this->writer_).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_002f1120;
  (this->writer_).buffer_.super_Buffer<char>.ptr_ = (this->writer_).buffer_.data_;
  (this->writer_).buffer_.super_Buffer<char>.size_ = 0;
  (this->writer_).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->writer_).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002f1168;
  ReadNames(this,filename,num_items);
  return;
}

Assistant:

mp::NameProvider::NameProvider(
    fmt::CStringRef filename, fmt::CStringRef gen_name, std::size_t num_items)
  : gen_name_(gen_name.c_str()) {
  ReadNames(filename, num_items);
}